

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

package * lsvm::object::new_package(symbol *name)

{
  long lVar1;
  package *ppVar2;
  hashmap *phVar3;
  long *plVar4;
  
  if (packages == 0) {
    plVar4 = &packages;
  }
  else {
    plVar4 = &packages;
    do {
      lVar1 = *plVar4;
      plVar4 = (long *)(lVar1 + 0x10);
    } while (*(long *)(lVar1 + 0x10) != 0);
  }
  ppVar2 = (package *)memory::allocate(0x18);
  ppVar2->name = name;
  phVar3 = hashmap::new_hashmap
                     (symbol::symbol_equals,symbol::symbol_hash,'\x01','\x03',3,100,7,0x2ac5);
  ppVar2->classes = phVar3;
  *plVar4 = (long)ppVar2;
  return ppVar2;
}

Assistant:

package* new_package(symbol* name){

    package** parent = &packages;
    if(*parent != null){
        do{
            parent = &((*parent)->next);
        }while(*parent != null);
    }

    package* pkg = (package*)lsvm::memory::allocate(sizeof(package));
    pkg->name = name;
    pkg->classes = lsvm::symbol::new_symbolmap();
    *parent = pkg;
    return pkg;    
}